

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptorTables * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateFileTables(Tables *this)

{
  FileDescriptorTables *this_00;
  FileDescriptorTables *local_18;
  FileDescriptorTables *result;
  Tables *this_local;
  
  result = (FileDescriptorTables *)this;
  this_00 = (FileDescriptorTables *)operator_new(0xf0);
  FileDescriptorTables::FileDescriptorTables(this_00);
  local_18 = this_00;
  std::
  vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
  ::push_back(&this->file_tables_,&local_18);
  return local_18;
}

Assistant:

FileDescriptorTables* DescriptorPool::Tables::AllocateFileTables() {
  FileDescriptorTables* result = new FileDescriptorTables;
  file_tables_.push_back(result);
  return result;
}